

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.hpp
# Opt level: O3

EquationSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>
* __thiscall
LinearSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
::SolveImpl(EquationSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>
            *__return_storage_ptr__,
           LinearSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
           *this,Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                 *polynome)

{
  cpp_dec_float<100U,_int,_void> *u;
  initializer_list<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  __l;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  x;
  allocator_type local_d9;
  cpp_dec_float<100U,_int,_void> local_d8;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  local_88;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_68;
  
  u = &((polynome->coeffs).
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->m_backend;
  local_d8.fpclass = cpp_dec_float_finite;
  local_d8.prec_elem = 0x10;
  local_d8.data._M_elems[0] = 0;
  local_d8.data._M_elems[1] = 0;
  local_d8.data._M_elems[2] = 0;
  local_d8.data._M_elems[3] = 0;
  local_d8.data._M_elems[4] = 0;
  local_d8.data._M_elems[5] = 0;
  local_d8.data._M_elems[6] = 0;
  local_d8.data._M_elems[7] = 0;
  local_d8.data._M_elems[8] = 0;
  local_d8.data._M_elems[9] = 0;
  local_d8.data._M_elems[10] = 0;
  local_d8.data._M_elems[0xb] = 0;
  local_d8.data._M_elems[0xc] = 0;
  local_d8.data._M_elems[0xd] = 0;
  local_d8.data._M_elems._56_5_ = 0;
  local_d8.data._M_elems[0xf]._1_3_ = 0;
  local_d8.exp = 0;
  local_d8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_d8,u,u + 1);
  if (local_d8.data._M_elems[0] != 0 || local_d8.fpclass != cpp_dec_float_finite) {
    local_d8.neg = (bool)(local_d8.neg ^ 1);
  }
  local_68.m_backend.data._M_elems[0xf]._1_3_ = local_d8.data._M_elems[0xf]._1_3_;
  local_68.m_backend.data._M_elems._56_5_ = local_d8.data._M_elems._56_5_;
  local_68.m_backend.data._M_elems[0xc] = local_d8.data._M_elems[0xc];
  local_68.m_backend.data._M_elems[0xd] = local_d8.data._M_elems[0xd];
  local_68.m_backend.data._M_elems[8] = local_d8.data._M_elems[8];
  local_68.m_backend.data._M_elems[9] = local_d8.data._M_elems[9];
  local_68.m_backend.data._M_elems[10] = local_d8.data._M_elems[10];
  local_68.m_backend.data._M_elems[0xb] = local_d8.data._M_elems[0xb];
  local_68.m_backend.data._M_elems[4] = local_d8.data._M_elems[4];
  local_68.m_backend.data._M_elems[5] = local_d8.data._M_elems[5];
  local_68.m_backend.data._M_elems[6] = local_d8.data._M_elems[6];
  local_68.m_backend.data._M_elems[7] = local_d8.data._M_elems[7];
  local_68.m_backend.data._M_elems[0] = local_d8.data._M_elems[0];
  local_68.m_backend.data._M_elems[1] = local_d8.data._M_elems[1];
  local_68.m_backend.data._M_elems[2] = local_d8.data._M_elems[2];
  local_68.m_backend.data._M_elems[3] = local_d8.data._M_elems[3];
  local_68.m_backend.exp = local_d8.exp;
  local_68.m_backend.fpclass = local_d8.fpclass;
  local_68.m_backend.prec_elem = local_d8.prec_elem;
  __l._M_len = 1;
  __l._M_array = &local_68;
  local_68.m_backend.neg = local_d8.neg;
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::vector(&local_88,__l,&local_d9);
  *(pointer *)
   &(__return_storage_ptr__->
    super__Variant_base<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_SpecificSolution>
    ).
    super__Move_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
    .
    super__Copy_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
    .
    super__Move_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
    .
    super__Copy_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
    .
    super__Variant_storage_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
    ._M_u = local_88.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super__Variant_base<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_SpecificSolution>
           ).
           super__Move_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
           .
           super__Copy_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
           .
           super__Move_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
           .
           super__Copy_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
           .
           super__Variant_storage_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
           ._M_u + 8) =
       local_88.
       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(__return_storage_ptr__->
           super__Variant_base<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_SpecificSolution>
           ).
           super__Move_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
           .
           super__Copy_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
           .
           super__Move_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
           .
           super__Copy_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
           .
           super__Variant_storage_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
           ._M_u + 0x10) =
       local_88.
       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->
  super__Variant_base<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_SpecificSolution>
  ).
  super__Move_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
  .
  super__Copy_assign_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
  .
  super__Move_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
  .
  super__Copy_ctor_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
  .
  super__Variant_storage_alias<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_SpecificSolution>
  ._M_index = '\0';
  return __return_storage_ptr__;
}

Assistant:

EquationSolution<ValueType> SolveImpl(const Polynome<ValueType> &polynome) const override {
        const ValueType &b = polynome.B();
        const ValueType &c = polynome.C();
        
        ValueType x = -c / b;
        
        return std::vector<ValueType>({x});
    }